

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::keep_alive(socket_t sock,time_t keep_alive_timeout_sec)

{
  ssize_t sVar1;
  rep rVar2;
  int local_54;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  long local_48;
  time_t timeout;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> duration;
  time_point current;
  ssize_t val;
  time_point start;
  time_t keep_alive_timeout_sec_local;
  socket_t sock_local;
  
  start.__d.__r = (duration)(duration)keep_alive_timeout_sec;
  val = std::chrono::_V2::steady_clock::now();
  while( true ) {
    sVar1 = select_read(sock,0,10000);
    if (sVar1 < 0) {
      return false;
    }
    if (sVar1 != 0) break;
    duration.__r = std::chrono::_V2::steady_clock::now();
    timeout = (time_t)std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&duration,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&val);
    local_38.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)&timeout);
    local_48 = (long)start.__d.__r * 1000;
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_38);
    if (local_48 < rVar2) {
      return false;
    }
    local_54 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_50,&local_54);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_50);
  }
  return true;
}

Assistant:

inline bool keep_alive(socket_t sock, time_t keep_alive_timeout_sec) {
  using namespace std::chrono;
  auto start = steady_clock::now();
  while (true) {
    auto val = select_read(sock, 0, 10000);
    if (val < 0) {
      return false;
    } else if (val == 0) {
      auto current = steady_clock::now();
      auto duration = duration_cast<milliseconds>(current - start);
      auto timeout = keep_alive_timeout_sec * 1000;
      if (duration.count() > timeout) { return false; }
      std::this_thread::sleep_for(std::chrono::milliseconds(1));
    } else {
      return true;
    }
  }
}